

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void free_handshake_space(st_quicly_handshake_space_t **space)

{
  st_quicly_handshake_space_t *space_00;
  
  space_00 = *space;
  if (space_00 != (st_quicly_handshake_space_t *)0x0) {
    if ((space_00->cipher).ingress.aead != (ptls_aead_context_t *)0x0) {
      dispose_cipher(&(space_00->cipher).ingress);
      space_00 = *space;
    }
    if ((space_00->cipher).egress.aead != (ptls_aead_context_t *)0x0) {
      dispose_cipher(&(space_00->cipher).egress);
      space_00 = *space;
    }
    do_free_pn_space(&space_00->super);
    *space = (st_quicly_handshake_space_t *)0x0;
  }
  return;
}

Assistant:

static void free_handshake_space(struct st_quicly_handshake_space_t **space)
{
    if (*space != NULL) {
        if ((*space)->cipher.ingress.aead != NULL)
            dispose_cipher(&(*space)->cipher.ingress);
        if ((*space)->cipher.egress.aead != NULL)
            dispose_cipher(&(*space)->cipher.egress);
        do_free_pn_space(&(*space)->super);
        *space = NULL;
    }
}